

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

void __thiscall
slang::ast::Compilation::setAttributes
          (Compilation *this,PortConnection *conn,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  bool bVar1;
  group15<boost::unordered::detail::foa::plain_integral> *this_00;
  raw_key_type *__y;
  pointer ppVar2;
  size_t in_RCX;
  table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  *in_RDX;
  try_emplace_args_t *in_RSI;
  size_t in_RDI;
  locator loc;
  size_t pos0;
  size_t hash;
  void **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  equal_to<const_void_*> *in_stack_fffffffffffffe58;
  table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  *in_stack_fffffffffffffe60;
  group15<boost::unordered::detail::foa::plain_integral> *args_1;
  try_emplace_args_t *hash_00;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  try_emplace_args_t *local_148;
  group15<boost::unordered::detail::foa::plain_integral> *local_140;
  void **in_stack_fffffffffffffec8;
  try_emplace_args_t *args;
  group15<boost::unordered::detail::foa::plain_integral> *hash_01;
  undefined7 in_stack_fffffffffffffee0;
  bool in_stack_fffffffffffffee7;
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  *local_80;
  try_emplace_args_t *local_78;
  undefined1 *local_70;
  group15<boost::unordered::detail::foa::plain_integral> *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
  *local_10;
  group15<boost::unordered::detail::foa::plain_integral> *local_8;
  
  this_00 = (group15<boost::unordered::detail::foa::plain_integral> *)(in_RDI + 0x3a0);
  local_148 = (try_emplace_args_t *)&stack0xfffffffffffffe78;
  local_70 = &stack0xfffffffffffffecf;
  hash_00 = in_RSI;
  local_140 = this_00;
  args = local_148;
  hash_01 = this_00;
  local_78 = local_148;
  local_68 = this_00;
  local_80 = (table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                ::key_from<void_const*>(local_148);
  local_88 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
             ::hash_for<void_const*>(in_stack_fffffffffffffe60,(void **)in_stack_fffffffffffffe58);
  local_90 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
             ::position_for(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  local_10 = local_80;
  local_20 = local_88;
  args_1 = this_00;
  local_18 = local_90;
  local_8 = this_00;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
               ::groups((table_arrays<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                         *)0x1185b54);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match(this_00,(size_t)in_stack_fffffffffffffe60);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                 ::elements((table_arrays<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                             *)0x1185b9f);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffe58 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                     *)0x1185bef);
        in_stack_fffffffffffffe60 = local_10;
        __y = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
              ::
              key_from<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>
                        ((pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>
                          *)0x1185c1b);
        bVar1 = std::equal_to<const_void_*>::operator()
                          (in_stack_fffffffffffffe58,(void **)in_stack_fffffffffffffe60,__y);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>
          ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
          goto LAB_01185d0e;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,*(size_t *)(args_1->m + 8));
    if (!bVar1) {
      memset(&local_a8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>
      ::table_locator(&local_a8);
LAB_01185d0e:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a8);
      if (bVar1) {
        local_b8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                   ::make_iterator((locator *)0x1185d2e);
        local_b9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_b8,&local_b9);
      }
      else if (*(ulong *)(this_00[2].m + 8) < *(ulong *)this_00[2].m) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
        ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
                  (in_RDX,in_RDI,(size_t)hash_00,in_RSI,(void **)args_1);
        local_d0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                   ::make_iterator((locator *)0x1185db3);
        local_e9[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_d0,local_e9);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(size_t)hash_01,
                   args,in_stack_fffffffffffffec8);
        local_100 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_slang::hash<const_void_*,_void>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>_>
                    ::make_iterator((locator *)0x1185e1e);
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_100,(bool *)&stack0xfffffffffffffee7);
      }
      ppVar2 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)0x1185e5a);
      (ppVar2->second)._M_ptr = (pointer)in_RDX;
      (ppVar2->second)._M_extent._M_extent_value = in_RCX;
      return;
    }
  }
  memset(&local_a8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>_>_>
  ::table_locator(&local_a8);
  goto LAB_01185d0e;
}

Assistant:

void Compilation::setAttributes(const PortConnection& conn,
                                std::span<const AttributeSymbol* const> attributes) {
    attributeMap[&conn] = attributes;
}